

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeStepToLeaf(RtreeCursor *pCur)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  u8 *pCellData_00;
  RtreeConstraint *p_00;
  RtreeConstraint *pConstraint;
  u8 *pCellData;
  sqlite3_rtree_dbl rScore;
  RtreeSearchPoint x;
  int eInt;
  int ii;
  int nConstraint;
  int nCell;
  int rc;
  int eWithin;
  RtreeNode *pNode;
  Rtree *pRtree;
  RtreeSearchPoint *p;
  RtreeCursor *pCur_local;
  
  pNode = (RtreeNode *)(pCur->base).pVtab;
  nConstraint = 0;
  iVar1 = pCur->nConstraint;
  x._16_4_ = ZEXT14(*(undefined1 *)((long)&pNode->pNext + 6) == '\x01');
  p = (RtreeSearchPoint *)pCur;
  do {
    pRtree = (Rtree *)rtreeSearchPointFirst((RtreeCursor *)p);
    bVar2 = false;
    if (pRtree != (Rtree *)0x0) {
      bVar2 = *(u8 *)&(pRtree->base).zErrMsg != '\0';
    }
    if (!bVar2) {
      *(bool *)&p->id = pRtree == (Rtree *)0x0;
      return 0;
    }
    _rc = rtreeNodeOfFirstSearchPoint((RtreeCursor *)p,&nConstraint);
    if (nConstraint != 0) {
      return nConstraint;
    }
    iVar3 = readInt16(_rc->zData + 2);
    do {
      if (iVar3 <= (int)(uint)*(byte *)((long)&(pRtree->base).zErrMsg + 2)) goto LAB_0023333c;
      pCellData = (u8 *)0xbff0000000000000;
      pCellData_00 = _rc->zData +
                     (int)((uint)*(byte *)((long)&pNode->pNext + 7) *
                           (uint)*(byte *)((long)&(pRtree->base).zErrMsg + 2) + 4);
      nCell = 2;
      for (x._20_4_ = 0; (int)x._20_4_ < iVar1; x._20_4_ = x._20_4_ + 1) {
        p_00 = (RtreeConstraint *)((long)p[1].rScore + (long)(int)x._20_4_ * 0x18);
        if (p_00->op < 0x46) {
          if (*(char *)&(pRtree->base).zErrMsg == '\x01') {
            rtreeLeafConstraint(p_00,x._16_4_,pCellData_00,&nCell);
          }
          else {
            rtreeNonleafConstraint(p_00,x._16_4_,pCellData_00,&nCell);
          }
        }
        else {
          nConstraint = rtreeCallbackConstraint
                                  (p_00,x._16_4_,pCellData_00,(RtreeSearchPoint *)pRtree,
                                   (sqlite3_rtree_dbl *)&pCellData,&nCell);
          if (nConstraint != 0) {
            return nConstraint;
          }
        }
        if (nCell == 0) break;
      }
      *(char *)((long)&(pRtree->base).zErrMsg + 2) =
           *(char *)((long)&(pRtree->base).zErrMsg + 2) + '\x01';
    } while (nCell == 0);
    x.id._0_1_ = *(char *)&(pRtree->base).zErrMsg + 0xff;
    if ((u8)x.id == '\0') {
      x.rScore = *(RtreeDValue *)&(pRtree->base).nRef;
      x.id._2_1_ = *(char *)((long)&(pRtree->base).zErrMsg + 2) + 0xff;
    }
    else {
      x.rScore = (RtreeDValue)readInt64(pCellData_00);
      x.id._2_1_ = '\0';
    }
    if (iVar3 <= (int)(uint)*(byte *)((long)&(pRtree->base).zErrMsg + 2)) {
      rtreeSearchPointPop((RtreeCursor *)p);
    }
    if ((double)pCellData < 0.0) {
      pCellData = (u8 *)0x0;
    }
    pRtree = (Rtree *)rtreeSearchPointNew((RtreeCursor *)p,(RtreeDValue)pCellData,(u8)x.id);
    if (pRtree == (Rtree *)0x0) {
      return 7;
    }
    *(u8 *)((long)&(pRtree->base).zErrMsg + 1) = (u8)nCell;
    *(RtreeDValue *)&(pRtree->base).nRef = x.rScore;
    *(u8 *)((long)&(pRtree->base).zErrMsg + 2) = x.id._2_1_;
LAB_0023333c:
    if (iVar3 <= (int)(uint)*(byte *)((long)&(pRtree->base).zErrMsg + 2)) {
      rtreeSearchPointPop((RtreeCursor *)p);
    }
  } while( true );
}

Assistant:

static int rtreeStepToLeaf(RtreeCursor *pCur){
  RtreeSearchPoint *p;
  Rtree *pRtree = RTREE_OF_CURSOR(pCur);
  RtreeNode *pNode;
  int eWithin;
  int rc = SQLITE_OK;
  int nCell;
  int nConstraint = pCur->nConstraint;
  int ii;
  int eInt;
  RtreeSearchPoint x;

  eInt = pRtree->eCoordType==RTREE_COORD_INT32;
  while( (p = rtreeSearchPointFirst(pCur))!=0 && p->iLevel>0 ){
    pNode = rtreeNodeOfFirstSearchPoint(pCur, &rc);
    if( rc ) return rc;
    nCell = NCELL(pNode);
    assert( nCell<200 );
    while( p->iCell<nCell ){
      sqlite3_rtree_dbl rScore = (sqlite3_rtree_dbl)-1;
      u8 *pCellData = pNode->zData + (4+pRtree->nBytesPerCell*p->iCell);
      eWithin = FULLY_WITHIN;
      for(ii=0; ii<nConstraint; ii++){
        RtreeConstraint *pConstraint = pCur->aConstraint + ii;
        if( pConstraint->op>=RTREE_MATCH ){
          rc = rtreeCallbackConstraint(pConstraint, eInt, pCellData, p,
                                       &rScore, &eWithin);
          if( rc ) return rc;
        }else if( p->iLevel==1 ){
          rtreeLeafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }else{
          rtreeNonleafConstraint(pConstraint, eInt, pCellData, &eWithin);
        }
        if( eWithin==NOT_WITHIN ) break;
      }
      p->iCell++;
      if( eWithin==NOT_WITHIN ) continue;
      x.iLevel = p->iLevel - 1;
      if( x.iLevel ){
        x.id = readInt64(pCellData);
        x.iCell = 0;
      }else{
        x.id = p->id;
        x.iCell = p->iCell - 1;
      }
      if( p->iCell>=nCell ){
        RTREE_QUEUE_TRACE(pCur, "POP-S:");
        rtreeSearchPointPop(pCur);
      }
      if( rScore<RTREE_ZERO ) rScore = RTREE_ZERO;
      p = rtreeSearchPointNew(pCur, rScore, x.iLevel);
      if( p==0 ) return SQLITE_NOMEM;
      p->eWithin = (u8)eWithin;
      p->id = x.id;
      p->iCell = x.iCell;
      RTREE_QUEUE_TRACE(pCur, "PUSH-S:");
      break;
    }
    if( p->iCell>=nCell ){
      RTREE_QUEUE_TRACE(pCur, "POP-Se:");
      rtreeSearchPointPop(pCur);
    }
  }
  pCur->atEOF = p==0;
  return SQLITE_OK;
}